

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getBasisInverseCol
          (Highs *this,HighsInt col,double *col_vector,HighsInt *col_num_nz,HighsInt *col_indices)

{
  uint uVar1;
  HighsStatus HVar2;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> local_68;
  value_type_conflict1 local_50;
  string local_48;
  
  if (col_vector == (double *)0x0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getBasisInverseCol: col_vector is NULL\n");
  }
  else {
    uVar1 = (this->model_).lp_.num_row_;
    if (-1 < col && col < (int)uVar1) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_50 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&local_68,(ulong)uVar1,&local_50);
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[(uint)col] = 1.0;
        basisSolveInterface(this,&local_68,col_vector,col_num_nz,col_indices,false);
        if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return kOk;
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"getBasisInverseCol","");
      HVar2 = invertRequirementError(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return HVar2;
      }
      operator_delete(local_48._M_dataplus._M_p);
      return HVar2;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Column index %d out of range [0, %d] in getBasisInverseCol\n",(ulong)(uint)col,
                 (ulong)(uVar1 - 1));
  }
  return kError;
}

Assistant:

HighsStatus Highs::getBasisInverseCol(const HighsInt col, double* col_vector,
                                      HighsInt* col_num_nz,
                                      HighsInt* col_indices) {
  if (col_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisInverseCol: col_vector is NULL\n");
    return HighsStatus::kError;
  }
  // col_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  HighsInt num_row = model_.lp_.num_row_;
  if (col < 0 || col >= num_row) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Column index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT
                 "] in getBasisInverseCol\n",
                 col, num_row - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseCol");
  // Compute a col i of the inverse of the basis matrix by solving Bx=e_i
  vector<double> rhs;
  rhs.assign(num_row, 0);
  rhs[col] = 1;
  basisSolveInterface(rhs, col_vector, col_num_nz, col_indices, false);
  return HighsStatus::kOk;
}